

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProjectSettings.cpp
# Opt level: O1

Expected<ProjectSettings,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* ProjectSettings::readFromFile_abi_cxx11_(char *filename)

{
  ulong *puVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  reference_wrapper<const_yaml::Mapping> rVar3;
  reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  rVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  pointer pcVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 __rhs;
  bool bVar10;
  size_type sVar11;
  int iVar12;
  long lVar13;
  long lVar14;
  string *psVar15;
  path *__lhs;
  FILE *__stream;
  ulong uVar16;
  char *filename_00;
  yaml *in_RSI;
  Expected<ProjectSettings,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_RDI;
  size_t sVar17;
  ExpectedRef<const_Mapping,_std::string> automation;
  ExpectedRef<const_std::string,_std::string> type;
  ExpectedRef<const_std::string,_std::string> filename_1;
  string raw_file;
  ProjectSettings settings;
  ExpectedRef<const_Mapping,_std::string> map_audio_result;
  ExpectedRef<const_Mapping,_std::string> map_video_result;
  Expected<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  samplerate_result;
  ExpectedRef<const_std::string,_std::string> video_config_result;
  ExpectedRef<const_Mapping,_std::string> config_result;
  Expected<yaml::Value,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  top_result;
  undefined1 local_370 [32];
  bool local_350;
  undefined1 local_330 [32];
  bool local_310;
  undefined1 local_2f0 [32];
  undefined1 local_2d0 [32];
  bool local_2b0;
  yaml *local_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  undefined1 local_268 [72];
  _Alloc_hider local_220;
  size_type local_218;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_210;
  undefined1 local_200 [8];
  _Alloc_hider local_1f8;
  size_type local_1f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e8;
  _Alloc_hider local_1d8;
  size_type local_1d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c8;
  _Alloc_hider local_1b8;
  size_type local_1b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  undefined1 local_178 [32];
  char local_158;
  undefined1 local_150 [32];
  char local_130;
  long local_128;
  undefined1 local_120 [32];
  bool local_100;
  undefined1 local_f8 [32];
  bool local_d8;
  undefined1 local_d0 [32];
  char local_b0;
  anon_union_112_2_9b3c4038_for_Expected<yaml::Value,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_2
  local_a8;
  char local_38;
  
  local_290 = in_RSI;
  aAppDebugPrintf("Reading project settings from file %s");
  yaml::parse_abi_cxx11_
            ((Expected<yaml::Value,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_a8.value_,local_290,filename_00);
  if (local_38 == '\0') {
    pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_268 + 0x10)
    ;
    local_268._0_8_ = pbVar5;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_268,local_a8.error_.error_._M_dataplus._M_p,
               (pointer)(local_a8.error_.error_._M_string_length +
                        (long)local_a8.error_.error_._M_dataplus._M_p));
    paVar6 = &(in_RDI->field_0).value_.video.config_filename.field_2;
    *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      **)&in_RDI->field_0 = paVar6;
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_268._0_8_ ==
        pbVar5) {
      paVar6->_M_allocated_capacity = local_268._16_8_;
      *(undefined8 *)((long)&(in_RDI->field_0).value_.video.config_filename.field_2 + 8) =
           local_268._24_8_;
    }
    else {
      (in_RDI->field_0).value_.video.config_filename._M_dataplus._M_p = (pointer)local_268._0_8_;
      (in_RDI->field_0).value_.video.config_filename.field_2._M_allocated_capacity =
           local_268._16_8_;
    }
    (in_RDI->field_0).value_.video.config_filename._M_string_length = local_268._8_8_;
    local_268._8_8_ = 0;
    local_268._16_8_ = local_268._16_8_ & 0xffffffffffffff00;
    in_RDI->has_value_ = false;
    local_268._0_8_ = pbVar5;
    goto LAB_0012847c;
  }
  yaml::Value::getMapping_abi_cxx11_
            ((ExpectedRef<const_Mapping,_std::string> *)
             &((anon_union_32_2_9b3c4038_for_Expected<std::reference_wrapper<const_yaml::Mapping>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_2
                *)local_d0)->value_,&local_a8.value_);
  uVar9 = local_d0._0_8_;
  if (local_b0 == '\0') {
    rVar3._M_data = (Mapping *)(local_370 + 0x10);
    local_370._0_8_ = rVar3._M_data;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_370,"Top config entity is not an ojbect","");
    local_268._16_8_ = local_370._16_8_;
    uVar9 = local_370._8_8_;
    pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_268 + 0x10)
    ;
    if ((Mapping *)local_370._0_8_ == rVar3._M_data) {
      local_268._24_8_ = local_370._24_8_;
      local_268._0_8_ = pbVar5;
    }
    else {
      local_268._0_8_ = local_370._0_8_;
    }
    local_370._8_8_ = 0;
    local_370._16_8_ = local_370._16_8_ & 0xffffffffffffff00;
    puVar1 = (ulong *)((long)&in_RDI->field_0 + 0x10);
    *(ulong **)&in_RDI->field_0 = puVar1;
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_268._0_8_ ==
        pbVar5) {
      *puVar1 = local_268._16_8_;
      *(undefined8 *)((long)&(in_RDI->field_0).value_.video.config_filename.field_2 + 8) =
           local_268._24_8_;
    }
    else {
      (in_RDI->field_0).value_.video.config_filename._M_dataplus._M_p = (pointer)local_268._0_8_;
      *(undefined8 *)((long)&in_RDI->field_0 + 0x10) = local_268._16_8_;
    }
    (in_RDI->field_0).value_.video.config_filename._M_string_length = uVar9;
    local_268._8_8_ = 0;
    local_268._16_8_ = local_268._16_8_ & 0xffffffffffffff00;
    in_RDI->has_value_ = false;
    local_370._0_8_ = rVar3._M_data;
    local_268._0_8_ = pbVar5;
  }
  else {
    local_268._8_8_ = 0;
    local_268._16_8_ = local_268._16_8_ & 0xffffffffffffff00;
    local_268._32_4_ = 0;
    local_268._36_4_ = 0;
    local_268._40_8_ = 0;
    local_268._48_4_ = 0x10;
    local_268._56_8_ = (float *)0x0;
    local_268._64_4_ = None;
    local_220._M_p = (pointer)&local_210;
    local_218 = 0;
    local_210._M_local_buf[0] = '\0';
    local_200._0_4_ = 0x780;
    local_200._4_4_ = 0x438;
    local_1f8._M_p = (pointer)&local_1e8;
    local_1e8._M_allocated_capacity = 0x632e74726f707865;
    local_1f0 = 8;
    local_1e8._M_local_buf[8] = '\0';
    local_1d8._M_p = (pointer)&local_1c8;
    local_1d0 = 0;
    local_1c8._M_local_buf[0] = '\0';
    local_1b8._M_p = (pointer)&local_1a8;
    local_1b0 = 0;
    local_1a8._M_local_buf[0] = '\0';
    local_370._0_8_ = local_370 + 0x10;
    local_268._0_8_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_268 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_370,"video","");
    yaml::Mapping::getMapping
              ((ExpectedRef<const_Mapping,_std::string> *)
               &((anon_union_32_2_9b3c4038_for_Expected<std::reference_wrapper<const_yaml::Mapping>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_2
                  *)local_150)->value_,(Mapping *)uVar9,(string *)local_370);
    if ((Mapping *)local_370._0_8_ != (Mapping *)(local_370 + 0x10)) {
      operator_delete((void *)local_370._0_8_,local_370._16_8_ + 1);
    }
    uVar8 = local_150._0_8_;
    if (local_130 == '\0') {
      rVar3._M_data = (Mapping *)(local_370 + 0x10);
      local_370._0_8_ = rVar3._M_data;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_370,local_150._0_8_,local_150._8_8_ + local_150._0_8_);
      puVar1 = (ulong *)((long)&in_RDI->field_0 + 0x10);
      *(ulong **)&in_RDI->field_0 = puVar1;
      if ((Mapping *)local_370._0_8_ == rVar3._M_data) {
        *puVar1 = local_370._16_8_;
        *(undefined8 *)((long)&(in_RDI->field_0).value_.video.config_filename.field_2 + 8) =
             local_370._24_8_;
      }
      else {
        (in_RDI->field_0).value_.video.config_filename._M_dataplus._M_p = (pointer)local_370._0_8_;
        *(undefined8 *)((long)&in_RDI->field_0 + 0x10) = local_370._16_8_;
      }
      (in_RDI->field_0).value_.video.config_filename._M_string_length = local_370._8_8_;
      local_370._8_8_ = 0;
      local_370._16_8_ = local_370._16_8_ & 0xffffffffffffff00;
      in_RDI->has_value_ = false;
      local_370._0_8_ = rVar3._M_data;
    }
    else {
      local_370._0_8_ = local_370 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_370,"config_file","");
      yaml::Mapping::getString
                ((ExpectedRef<const_std::string,_std::string> *)local_f8,(Mapping *)uVar8,
                 (string *)local_370);
      if ((Mapping *)local_370._0_8_ != (Mapping *)(local_370 + 0x10)) {
        operator_delete((void *)local_370._0_8_,local_370._16_8_ + 1);
      }
      if (local_d8 == false) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_330,"Cannot read video config: ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8
                      );
        uVar9 = local_330._8_8_;
        rVar3._M_data = (Mapping *)(local_370 + 0x10);
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_330._0_8_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_330 + 0x10))
        {
          local_370._24_8_ = local_330._24_8_;
          local_370._0_8_ = rVar3._M_data;
        }
        else {
          local_370._0_8_ = local_330._0_8_;
        }
        local_370._17_7_ = local_330._17_7_;
        local_370[0x10] = local_330[0x10];
        local_330._8_8_ = 0;
        local_330[0x10] = '\0';
        paVar6 = &(in_RDI->field_0).value_.video.config_filename.field_2;
        *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          **)&in_RDI->field_0 = paVar6;
        if ((Mapping *)local_370._0_8_ == rVar3._M_data) {
          paVar6->_M_allocated_capacity = local_370._16_8_;
          *(undefined8 *)((long)&(in_RDI->field_0).value_.video.config_filename.field_2 + 8) =
               local_370._24_8_;
        }
        else {
          (in_RDI->field_0).value_.video.config_filename._M_dataplus._M_p = (pointer)local_370._0_8_
          ;
          (in_RDI->field_0).value_.video.config_filename.field_2._M_allocated_capacity =
               local_370._16_8_;
        }
        (in_RDI->field_0).value_.video.config_filename._M_string_length = uVar9;
        local_370._8_8_ = 0;
        local_370._16_8_ = (ulong)(uint7)local_330._17_7_ << 8;
        in_RDI->has_value_ = false;
        local_370._0_8_ = rVar3._M_data;
        local_330._0_8_ =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_330 + 0x10)
        ;
      }
      else {
        std::__cxx11::string::_M_assign((string *)local_268);
        local_370._0_8_ = local_370 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_370,"audio","");
        yaml::Mapping::getMapping
                  ((ExpectedRef<const_Mapping,_std::string> *)
                   &((anon_union_32_2_9b3c4038_for_Expected<std::reference_wrapper<const_yaml::Mapping>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_2
                      *)local_178)->value_,(Mapping *)uVar9,(string *)local_370);
        if ((Mapping *)local_370._0_8_ != (Mapping *)(local_370 + 0x10)) {
          operator_delete((void *)local_370._0_8_,local_370._16_8_ + 1);
        }
        uVar8 = local_178._0_8_;
        if (local_158 == '\0') {
          rVar3._M_data = (Mapping *)(local_370 + 0x10);
          local_370._0_8_ = rVar3._M_data;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_370,local_178._0_8_,local_178._8_8_ + local_178._0_8_);
          puVar1 = (ulong *)((long)&in_RDI->field_0 + 0x10);
          *(ulong **)&in_RDI->field_0 = puVar1;
          if ((Mapping *)local_370._0_8_ == rVar3._M_data) {
            *puVar1 = local_370._16_8_;
            *(undefined8 *)((long)&(in_RDI->field_0).value_.video.config_filename.field_2 + 8) =
                 local_370._24_8_;
          }
          else {
            (in_RDI->field_0).value_.video.config_filename._M_dataplus._M_p =
                 (pointer)local_370._0_8_;
            *(undefined8 *)((long)&in_RDI->field_0 + 0x10) = local_370._16_8_;
          }
          (in_RDI->field_0).value_.video.config_filename._M_string_length = local_370._8_8_;
          local_370._8_8_ = 0;
          local_370._16_8_ = local_370._16_8_ & 0xffffffffffffff00;
          in_RDI->has_value_ = false;
          local_370._0_8_ = rVar3._M_data;
        }
        else {
          local_370._0_8_ = local_370 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_370,"samplerate","");
          yaml::Mapping::getInt
                    ((Expected<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_120,(Mapping *)uVar8,(string *)local_370);
          if ((Mapping *)local_370._0_8_ != (Mapping *)(local_370 + 0x10)) {
            operator_delete((void *)local_370._0_8_,local_370._16_8_ + 1);
          }
          if (local_100 == false) {
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_330,"Error reading samplerate: ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_120);
            uVar9 = local_330._8_8_;
            rVar3._M_data = (Mapping *)(local_370 + 0x10);
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_330._0_8_
                == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_330 + 0x10)) {
              local_370._24_8_ = local_330._24_8_;
              local_370._0_8_ = rVar3._M_data;
            }
            else {
              local_370._0_8_ = local_330._0_8_;
            }
            local_370._17_7_ = local_330._17_7_;
            local_370[0x10] = local_330[0x10];
            local_330._8_8_ = 0;
            local_330[0x10] = '\0';
            paVar6 = &(in_RDI->field_0).value_.video.config_filename.field_2;
            *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              **)&in_RDI->field_0 = paVar6;
            if ((Mapping *)local_370._0_8_ == rVar3._M_data) {
              paVar6->_M_allocated_capacity = local_370._16_8_;
              *(undefined8 *)((long)&(in_RDI->field_0).value_.video.config_filename.field_2 + 8) =
                   local_370._24_8_;
            }
            else {
              (in_RDI->field_0).value_.video.config_filename._M_dataplus._M_p =
                   (pointer)local_370._0_8_;
              (in_RDI->field_0).value_.video.config_filename.field_2._M_allocated_capacity =
                   local_370._16_8_;
            }
            (in_RDI->field_0).value_.video.config_filename._M_string_length = uVar9;
            local_370._8_8_ = 0;
            local_370._16_8_ = (ulong)(uint7)local_330._17_7_ << 8;
            in_RDI->has_value_ = false;
            local_370._0_8_ = rVar3._M_data;
            local_330._0_8_ =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_330 + 0x10);
          }
          else {
            local_268._32_4_ = local_120._0_4_;
            local_370._0_8_ = local_370 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_370,"channels","");
            lVar13 = yaml::Mapping::getInt((Mapping *)uVar8,(string *)local_370,2);
            local_268._36_4_ = (int)lVar13;
            if ((Mapping *)local_370._0_8_ != (Mapping *)(local_370 + 0x10)) {
              operator_delete((void *)local_370._0_8_,local_370._16_8_ + 1);
            }
            local_370._0_8_ = local_370 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_370,"duration_sec","");
            local_128 = yaml::Mapping::getInt((Mapping *)uVar8,(string *)local_370,0x78);
            if ((Mapping *)local_370._0_8_ != (Mapping *)(local_370 + 0x10)) {
              operator_delete((void *)local_370._0_8_,local_370._16_8_ + 1);
            }
            local_370._0_8_ = local_370 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_370,"bpm","");
            lVar13 = yaml::Mapping::getInt((Mapping *)uVar8,(string *)local_370,0x3c);
            if ((Mapping *)local_370._0_8_ != (Mapping *)(local_370 + 0x10)) {
              operator_delete((void *)local_370._0_8_,local_370._16_8_ + 1);
            }
            local_370._0_8_ = local_370 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_370,"rows_per_beat","");
            lVar14 = yaml::Mapping::getInt((Mapping *)uVar8,(string *)local_370,8);
            if ((Mapping *)local_370._0_8_ != (Mapping *)(local_370 + 0x10)) {
              operator_delete((void *)local_370._0_8_,local_370._16_8_ + 1);
            }
            local_370._0_8_ = local_370 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_370,"raw_file","");
            local_330._0_8_ = local_330 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_330,"");
            psVar15 = yaml::Mapping::getString
                                ((Mapping *)uVar8,(string *)local_370,(string *)local_330);
            local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
            pcVar7 = (psVar15->_M_dataplus)._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_288,pcVar7,pcVar7 + psVar15->_M_string_length);
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_330._0_8_
                != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_330 + 0x10)) {
              operator_delete((void *)local_330._0_8_,CONCAT71(local_330._17_7_,local_330[0x10]) + 1
                             );
            }
            if ((Mapping *)local_370._0_8_ != (Mapping *)(local_370 + 0x10)) {
              operator_delete((void *)local_370._0_8_,local_370._16_8_ + 1);
            }
            local_268._40_8_ =
                 (ulong)(uint)((local_268._32_4_ * 0x3c) / ((int)lVar14 * (int)lVar13)) << 0x20;
            if (local_288._M_string_length != 0) {
              std::experimental::filesystem::v1::__cxx11::path::
              path<char_const*,std::experimental::filesystem::v1::__cxx11::path>
                        ((path *)local_330,(char **)&local_290);
              __lhs = (path *)std::experimental::filesystem::v1::__cxx11::path::remove_filename
                                        ((path *)local_330);
              std::experimental::filesystem::v1::__cxx11::path::
              path<std::__cxx11::string,std::experimental::filesystem::v1::__cxx11::path>
                        ((path *)local_2d0,&local_288);
              std::experimental::filesystem::v1::__cxx11::operator/
                        ((path *)local_370,__lhs,(path *)local_2d0);
              local_2f0._0_8_ =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(local_2f0 + 0x10);
              std::__cxx11::string::
              _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                        ((string *)local_2f0,local_370._0_8_,
                         (pointer)(local_370._8_8_ + local_370._0_8_));
              __stream = fopen((char *)local_2f0._0_8_,"rb");
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2f0._0_8_ !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(local_2f0 + 0x10)) {
                operator_delete((void *)local_2f0._0_8_,local_2f0._16_8_ + 1);
              }
              std::experimental::filesystem::v1::__cxx11::path::~path((path *)local_370);
              std::experimental::filesystem::v1::__cxx11::path::~path((path *)local_2d0);
              std::experimental::filesystem::v1::__cxx11::path::~path((path *)local_330);
              if (__stream != (FILE *)0x0) {
                fseek(__stream,0,2);
                uVar16 = ftell(__stream);
                local_268._40_4_ = (int)(uVar16 / (ulong)((long)(int)local_268._36_4_ << 2));
                fseek(__stream,0,0);
                sVar17 = (size_t)(int)local_268._40_4_;
                uVar16 = 0xffffffffffffffff;
                if (-1 < (long)sVar17) {
                  uVar16 = sVar17 * 8;
                }
                local_268._56_8_ = operator_new__(uVar16);
                sVar17 = fread((void *)local_268._56_8_,(long)(int)local_268._36_4_ << 2,sVar17,
                               __stream);
                if (local_268._40_4_ != (int)sVar17 || local_268._40_4_ == 0) {
                  if ((float *)local_268._56_8_ != (float *)0x0) {
                    operator_delete__((void *)local_268._56_8_);
                  }
                  local_268._56_8_ = (float *)0x0;
                }
                fclose(__stream);
              }
            }
            if ((float *)local_268._56_8_ == (float *)0x0) {
              aAppDebugPrintf("No raw audio available, continuing in silence");
              local_268._40_4_ = (int)local_128 * local_268._32_4_;
            }
            local_330._0_8_ = local_330 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_330,"automation","");
            yaml::Mapping::getMapping
                      ((ExpectedRef<const_Mapping,_std::string> *)local_370,(Mapping *)uVar9,
                       (string *)local_330);
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_330._0_8_
                != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_330 + 0x10)) {
              operator_delete((void *)local_330._0_8_,CONCAT71(local_330._17_7_,local_330[0x10]) + 1
                             );
            }
            uVar8 = local_370._0_8_;
            if (local_350 == true) {
              rVar4._M_data =
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_2d0 + 0x10);
              local_2d0._0_8_ = rVar4._M_data;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_2d0,"type","");
              yaml::Mapping::getString
                        ((ExpectedRef<const_std::string,_std::string> *)local_330,(Mapping *)uVar8,
                         (string *)local_2d0);
              if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  local_2d0._0_8_ != rVar4._M_data) {
                operator_delete((void *)local_2d0._0_8_,local_2d0._16_8_ + 1);
              }
              __rhs = local_330._0_8_;
              if (local_310 != false) {
                iVar12 = std::__cxx11::string::compare((char *)local_330._0_8_);
                if (iVar12 == 0) {
                  local_268._64_4_ = Rocket;
                }
                else {
                  iVar12 = std::__cxx11::string::compare((char *)__rhs);
                  if (iVar12 == 0) {
                    local_268._64_4_ = Gui;
                  }
                  else {
                    iVar12 = std::__cxx11::string::compare((char *)__rhs);
                    if (iVar12 == 0) {
                      local_268._64_4_ = Basic;
                      paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                *)(local_2f0 + 0x10);
                      local_2f0._0_8_ = paVar6;
                      std::__cxx11::string::_M_construct<char_const*>((string *)local_2f0,"file","")
                      ;
                      yaml::Mapping::getString
                                ((ExpectedRef<const_std::string,_std::string> *)local_2d0,
                                 (Mapping *)uVar8,(string *)local_2f0);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_2f0._0_8_ != paVar6) {
                        operator_delete((void *)local_2f0._0_8_,local_2f0._16_8_ + 1);
                      }
                      bVar10 = local_2b0;
                      if (local_2b0 == false) {
                        std::operator+(&local_198,"Cannot read basic automation file: ",
                                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_2d0);
                        sVar11 = local_198._M_string_length;
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_198._M_dataplus._M_p == &local_198.field_2) {
                          local_2f0._24_8_ = local_198.field_2._8_8_;
                          local_2f0._0_8_ = paVar6;
                        }
                        else {
                          local_2f0._0_8_ = local_198._M_dataplus._M_p;
                        }
                        local_2f0._17_7_ = local_198.field_2._M_allocated_capacity._1_7_;
                        local_2f0[0x10] = local_198.field_2._M_local_buf[0];
                        local_198._M_string_length = 0;
                        local_198.field_2._M_local_buf[0] = '\0';
                        paVar2 = &(in_RDI->field_0).value_.video.config_filename.field_2;
                        *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          **)&in_RDI->field_0 = paVar2;
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_2f0._0_8_ == paVar6) {
                          paVar2->_M_allocated_capacity = local_2f0._16_8_;
                          *(undefined8 *)
                           ((long)&(in_RDI->field_0).value_.video.config_filename.field_2 + 8) =
                               local_2f0._24_8_;
                        }
                        else {
                          (in_RDI->field_0).value_.video.config_filename._M_dataplus._M_p =
                               (pointer)local_2f0._0_8_;
                          (in_RDI->field_0).value_.video.config_filename.field_2.
                          _M_allocated_capacity = local_2f0._16_8_;
                        }
                        (in_RDI->field_0).value_.video.config_filename._M_string_length = sVar11;
                        local_2f0._8_8_ = 0;
                        local_2f0._16_8_ =
                             (ulong)(uint7)local_198.field_2._M_allocated_capacity._1_7_ << 8;
                        in_RDI->has_value_ = false;
                        local_2f0._0_8_ = paVar6;
                        local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
                      }
                      else {
                        std::__cxx11::string::_M_assign((string *)&local_220);
                      }
                      if ((local_2b0 == false) &&
                         ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_2d0._0_8_ != rVar4._M_data)) {
                        operator_delete((void *)local_2d0._0_8_,local_2d0._16_8_ + 1);
                      }
                      if (bVar10 == false) goto LAB_00127e6f;
                    }
                    else {
                      iVar12 = std::__cxx11::string::compare((char *)__rhs);
                      if (iVar12 != 0) {
                        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_2f0,"Unexpected automation type ",
                                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)__rhs);
                        goto LAB_00127d97;
                      }
                    }
                  }
                }
                if ((local_310 == false) &&
                   ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    local_330._0_8_ !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    (local_330 + 0x10))) {
                  operator_delete((void *)local_330._0_8_,
                                  CONCAT71(local_330._17_7_,local_330[0x10]) + 1);
                }
                goto LAB_00127ef8;
              }
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_2f0,"Cannot read automation: ",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_330);
LAB_00127d97:
              local_2d0._16_8_ = local_2f0._16_8_;
              uVar9 = local_2f0._8_8_;
              if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  local_2f0._0_8_ ==
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  (local_2f0 + 0x10)) {
                local_2d0._24_8_ = local_2f0._24_8_;
                local_2d0._0_8_ = rVar4._M_data;
              }
              else {
                local_2d0._0_8_ = local_2f0._0_8_;
              }
              local_2f0._8_8_ = 0;
              local_2f0._16_8_ = local_2f0._16_8_ & 0xffffffffffffff00;
              paVar6 = &(in_RDI->field_0).value_.video.config_filename.field_2;
              *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                **)&in_RDI->field_0 = paVar6;
              if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  local_2d0._0_8_ == rVar4._M_data) {
                paVar6->_M_allocated_capacity = local_2d0._16_8_;
                *(undefined8 *)((long)&(in_RDI->field_0).value_.video.config_filename.field_2 + 8) =
                     local_2d0._24_8_;
              }
              else {
                (in_RDI->field_0).value_.video.config_filename._M_dataplus._M_p =
                     (pointer)local_2d0._0_8_;
                (in_RDI->field_0).value_.video.config_filename.field_2._M_allocated_capacity =
                     local_2d0._16_8_;
              }
              (in_RDI->field_0).value_.video.config_filename._M_string_length = uVar9;
              local_2d0._8_8_ = 0;
              local_2d0._16_8_ = local_2d0._16_8_ & 0xffffffffffffff00;
              in_RDI->has_value_ = false;
              local_2f0._0_8_ =
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_2f0 + 0x10);
              local_2d0._0_8_ = rVar4._M_data;
LAB_00127e6f:
              if ((local_310 == false) &&
                 ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  local_330._0_8_ !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  (local_330 + 0x10))) {
                operator_delete((void *)local_330._0_8_,
                                CONCAT71(local_330._17_7_,local_330[0x10]) + 1);
              }
              if ((local_350 == false) &&
                 ((Mapping *)local_370._0_8_ != (Mapping *)(local_370 + 0x10))) {
                operator_delete((void *)local_370._0_8_,local_370._16_8_ + 1);
              }
            }
            else {
LAB_00127ef8:
              if ((local_350 == false) &&
                 ((Mapping *)local_370._0_8_ != (Mapping *)(local_370 + 0x10))) {
                operator_delete((void *)local_370._0_8_,local_370._16_8_ + 1);
              }
              local_330._0_8_ = local_330 + 0x10;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_330,"export","");
              yaml::Mapping::getMapping
                        ((ExpectedRef<const_Mapping,_std::string> *)local_370,(Mapping *)uVar9,
                         (string *)local_330);
              if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  local_330._0_8_ !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  (local_330 + 0x10)) {
                operator_delete((void *)local_330._0_8_,
                                CONCAT71(local_330._17_7_,local_330[0x10]) + 1);
              }
              uVar9 = local_370._0_8_;
              if (local_350 == true) {
                rVar4._M_data =
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_2d0 + 0x10);
                local_2d0._0_8_ = rVar4._M_data;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_2d0,"width","");
                yaml::Mapping::getInt
                          ((Expected<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)local_330,(Mapping *)uVar9,(string *)local_2d0);
                if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    local_2d0._0_8_ != rVar4._M_data) {
                  operator_delete((void *)local_2d0._0_8_,local_2d0._16_8_ + 1);
                }
                if (local_310 == true) {
                  local_200._0_4_ = local_330._0_4_;
                }
                else {
                  aAppDebugPrintf("Cannot read export.width: %s. Continuing with default",
                                  local_330._0_8_);
                }
                if ((local_310 == false) &&
                   ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    local_330._0_8_ !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    (local_330 + 0x10))) {
                  operator_delete((void *)local_330._0_8_,
                                  CONCAT71(local_330._17_7_,local_330[0x10]) + 1);
                }
                local_2d0._0_8_ = rVar4._M_data;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_2d0,"height","");
                yaml::Mapping::getInt
                          ((Expected<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)local_330,(Mapping *)uVar9,(string *)local_2d0);
                if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    local_2d0._0_8_ != rVar4._M_data) {
                  operator_delete((void *)local_2d0._0_8_,local_2d0._16_8_ + 1);
                }
                if (local_310 == true) {
                  local_200._4_4_ = local_330._0_4_;
                }
                else {
                  aAppDebugPrintf("Cannot read export.height: %s. Continuing with default",
                                  local_330._0_8_);
                }
                if ((local_310 == false) &&
                   ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    local_330._0_8_ !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    (local_330 + 0x10))) {
                  operator_delete((void *)local_330._0_8_,
                                  CONCAT71(local_330._17_7_,local_330[0x10]) + 1);
                }
                local_2d0._0_8_ = rVar4._M_data;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_2d0,"c_source","");
                yaml::Mapping::getString
                          ((ExpectedRef<const_std::string,_std::string> *)local_330,(Mapping *)uVar9
                           ,(string *)local_2d0);
                if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    local_2d0._0_8_ != rVar4._M_data) {
                  operator_delete((void *)local_2d0._0_8_,local_2d0._16_8_ + 1);
                }
                if (local_310 == true) {
                  std::__cxx11::string::_M_assign((string *)&local_1f8);
                }
                else {
                  aAppDebugPrintf("Cannot read export.c_source: %s. Continuing with default",
                                  local_330._0_8_);
                }
                if ((local_310 == false) &&
                   ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    local_330._0_8_ !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    (local_330 + 0x10))) {
                  operator_delete((void *)local_330._0_8_,
                                  CONCAT71(local_330._17_7_,local_330[0x10]) + 1);
                }
                local_2d0._0_8_ = rVar4._M_data;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_2d0,"shader_path","");
                yaml::Mapping::getString
                          ((ExpectedRef<const_std::string,_std::string> *)local_330,(Mapping *)uVar9
                           ,(string *)local_2d0);
                if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    local_2d0._0_8_ != rVar4._M_data) {
                  operator_delete((void *)local_2d0._0_8_,local_2d0._16_8_ + 1);
                }
                if (local_310 == true) {
                  std::__cxx11::string::_M_assign((string *)&local_1d8);
                }
                else {
                  aAppDebugPrintf("Cannot read export.shader_path: %s. Continuing with default",
                                  local_330._0_8_);
                }
                if ((local_310 == false) &&
                   ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    local_330._0_8_ !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    (local_330 + 0x10))) {
                  operator_delete((void *)local_330._0_8_,
                                  CONCAT71(local_330._17_7_,local_330[0x10]) + 1);
                }
                local_2d0._0_8_ = rVar4._M_data;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_2d0,"shader_suffix","");
                yaml::Mapping::getString
                          ((ExpectedRef<const_std::string,_std::string> *)local_330,(Mapping *)uVar9
                           ,(string *)local_2d0);
                if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    local_2d0._0_8_ != rVar4._M_data) {
                  operator_delete((void *)local_2d0._0_8_,local_2d0._16_8_ + 1);
                }
                if (local_310 == true) {
                  std::__cxx11::string::_M_assign((string *)&local_1b8);
                }
                else {
                  aAppDebugPrintf("Cannot read export.shader_suffix: %s. Continuing with default",
                                  local_330._0_8_);
                }
                if ((local_310 == false) &&
                   ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    local_330._0_8_ !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    (local_330 + 0x10))) {
                  operator_delete((void *)local_330._0_8_,
                                  CONCAT71(local_330._17_7_,local_330[0x10]) + 1);
                }
              }
              else {
                aAppDebugPrintf("Cannot read export section: %s. Continuing with defaults",
                                local_370._0_8_);
              }
              if ((local_350 == false) &&
                 ((Mapping *)local_370._0_8_ != (Mapping *)(local_370 + 0x10))) {
                operator_delete((void *)local_370._0_8_,local_370._16_8_ + 1);
              }
              Expected<ProjectSettings,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::Expected(in_RDI,(ProjectSettings *)local_268);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_288._M_dataplus._M_p != &local_288.field_2) {
              operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1
                             );
            }
          }
          if ((local_100 == false) &&
             ((undefined1 *)CONCAT44(local_120._4_4_,local_120._0_4_) != local_120 + 0x10)) {
            operator_delete((undefined1 *)CONCAT44(local_120._4_4_,local_120._0_4_),
                            local_120._16_8_ + 1);
          }
        }
        if ((local_158 == '\0') &&
           ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_178._0_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)((long)&(((anon_union_32_2_9b3c4038_for_Expected<std::reference_wrapper<const_yaml::Mapping>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_2
                          *)local_178)->error_).error_ + 0x10U))) {
          operator_delete((void *)local_178._0_8_,local_178._16_8_ + 1);
        }
      }
      if ((local_d8 == false) &&
         ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8._0_8_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_f8 + 0x10))) {
        operator_delete((void *)local_f8._0_8_,local_f8._16_8_ + 1);
      }
    }
    if ((local_130 == '\0') &&
       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)((long)&(((anon_union_32_2_9b3c4038_for_Expected<std::reference_wrapper<const_yaml::Mapping>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_2
                      *)local_150)->error_).error_ + 0x10U))) {
      operator_delete((void *)local_150._0_8_,local_150._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_p != &local_1a8) {
      operator_delete(local_1b8._M_p,
                      CONCAT71(local_1a8._M_allocated_capacity._1_7_,local_1a8._M_local_buf[0]) + 1)
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_p != &local_1c8) {
      operator_delete(local_1d8._M_p,
                      CONCAT71(local_1c8._M_allocated_capacity._1_7_,local_1c8._M_local_buf[0]) + 1)
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_p != &local_1e8) {
      operator_delete(local_1f8._M_p,local_1e8._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_220._M_p != &local_210) {
      operator_delete(local_220._M_p,
                      CONCAT71(local_210._M_allocated_capacity._1_7_,local_210._M_local_buf[0]) + 1)
      ;
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_268._0_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_268 + 0x10)) {
      operator_delete((void *)local_268._0_8_,local_268._16_8_ + 1);
    }
  }
  if ((local_b0 == '\0') &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._0_8_ !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)((long)&(((anon_union_32_2_9b3c4038_for_Expected<std::reference_wrapper<const_yaml::Mapping>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_2
                    *)local_d0)->error_).error_ + 0x10U))) {
    operator_delete((void *)local_d0._0_8_,local_d0._16_8_ + 1);
  }
LAB_0012847c:
  Expected<yaml::Value,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~Expected((Expected<yaml::Value,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_a8.value_);
  return in_RDI;
}

Assistant:

Expected<ProjectSettings, std::string> ProjectSettings::readFromFile(const char *filename) {
	MSG("Reading project settings from file %s", filename);

	const auto top_result = yaml::parse(filename);
	if (!top_result)
		return Unexpected(top_result.error());

	const yaml::Value &top = top_result.value();
	const auto config_result = top.getMapping();
	if (!config_result)
		return Unexpected<std::string>("Top config entity is not an ojbect");
	const yaml::Mapping &config = config_result.value();

	ProjectSettings settings;
	auto map_video_result = config.getMapping("video");
	if (!map_video_result)
		return Unexpected(map_video_result.error());
	auto video_config_result = map_video_result.value().get().getString("config_file");
	if (!video_config_result)
		return Unexpected("Cannot read video config: " + video_config_result.error());
	settings.video.config_filename = video_config_result.value();

	auto map_audio_result = config.getMapping("audio");
	if (!map_audio_result)
		return Unexpected(map_audio_result.error());
	const yaml::Mapping &yaudio = map_audio_result.value();
	auto samplerate_result = yaudio.getInt("samplerate");
	if (!samplerate_result)
		return Unexpected("Error reading samplerate: " + samplerate_result.error());
	settings.audio.samplerate = samplerate_result.value();
	settings.audio.channels = yaudio.getInt("channels", 2);

	const int duration_sec = yaudio.getInt("duration_sec", 120);
	const int bpm = yaudio.getInt("bpm", 60);
	const int rows_per_beat = yaudio.getInt("rows_per_beat", 8);
	const std::string raw_file = yaudio.getString("raw_file", "");

	settings.audio.samples_per_row = settings.audio.samplerate * 60 / (bpm * rows_per_beat);
	settings.audio.samples = 0;

	if (!raw_file.empty()) {
		FILE *f = fopen((fs::path(filename).remove_filename()/raw_file).string().c_str(), "rb");
		if (f) {
			fseek(f, 0L, SEEK_END);
			settings.audio.samples = ftell(f) / (sizeof(float) * settings.audio.channels);
			fseek(f, 0L, SEEK_SET);
			settings.audio.data = new float[settings.audio.samples * 2];
			const int samples_read = fread(settings.audio.data, sizeof(float) * settings.audio.channels, settings.audio.samples, f);
			if (settings.audio.samples != samples_read || !settings.audio.samples) {
				delete[] settings.audio.data;
				settings.audio.data = nullptr;
			}
			fclose(f);
		}
	}

	if (!settings.audio.data) {
		MSG("No raw audio available, continuing in silence");
		settings.audio.samples = settings.audio.samplerate * duration_sec;
	}

	if (auto automation = config.getMapping("automation")) {
		const yaml::Mapping &yautomation = automation.value();
		auto type = yautomation.getString("type");
		if (!type)
			return Unexpected("Cannot read automation: " + type.error());
		const std::string &ytype = type.value();
		if (ytype == "Rocket")
			settings.automation.type = Automation::Type::Rocket;
		else if (ytype == "Gui")
			settings.automation.type = Automation::Type::Gui;
		else if (ytype == "Basic") {
			settings.automation.type = Automation::Type::Basic;
			auto filename = yautomation.getString("file");
			if (!filename)
				return Unexpected("Cannot read basic automation file: " + filename.error());
			settings.automation.filename = filename.value();
		} else if (ytype == "None") {
		} else
			return Unexpected("Unexpected automation type " + ytype);
	}

	if (auto map_export = config.getMapping("export")) {
		const yaml::Mapping &exports = map_export.value();
	#define READ_VALUE(name, getType) \
		if (auto name = exports.getType(#name)) \
			settings.exports.name = name.value(); \
		else \
			MSG("Cannot read export." #name ": %s. Continuing with default", name.error().c_str())

		READ_VALUE(width, getInt);
		READ_VALUE(height, getInt);
		READ_VALUE(c_source, getString);
		READ_VALUE(shader_path, getString);
		READ_VALUE(shader_suffix, getString);
		//READ_VALUE(shader_concat, getInt);
	} else {
		MSG("Cannot read export section: %s. Continuing with defaults", map_export.error().c_str());
	}

	return settings;
}